

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::~GLShaderProgram(GLShaderProgram *this)

{
  (this->super_ShaderProgram)._vptr_ShaderProgram = (_func_int **)&PTR__GLShaderProgram_005993f0;
  (*glad_glDeleteVertexArrays)(1,&this->vaoHandle);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->compiledProgram).
              super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
  ::~vector(&this->textures);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderAttribute>_>
  ::~vector(&this->attributes);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderUniform>_>
  ::~vector(&this->uniforms);
  ShaderProgram::~ShaderProgram(&this->super_ShaderProgram);
  return;
}

Assistant:

GLShaderProgram::~GLShaderProgram() { glDeleteVertexArrays(1, &vaoHandle); }